

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O3

Code * __thiscall md::Code::bset(Code *this,DataRegister *dx,Param *target)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  uchar local_41;
  uchar local_40;
  undefined7 uStack_3f;
  uchar *local_38;
  long local_30;
  
  iVar1 = (**(dx->super_Register).super_Param._vptr_Param)(dx);
  iVar2 = (*target->_vptr_Param[1])(target);
  iVar3 = (**target->_vptr_Param)(target);
  iVar1 = iVar3 + iVar1 * 0x200 + iVar2 * 8 + 0x1c0;
  local_40 = (uchar)((uint)iVar1 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  local_40 = (uchar)iVar1;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  (*target->_vptr_Param[2])(&local_40,target);
  puVar4 = (uchar *)CONCAT71(uStack_3f,local_40);
  if (puVar4 != local_38) {
    do {
      local_41 = *puVar4;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_41);
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_38);
    puVar4 = (uchar *)CONCAT71(uStack_3f,local_40);
  }
  if (puVar4 != (uchar *)0x0) {
    operator_delete(puVar4,local_30 - (long)puVar4);
  }
  return this;
}

Assistant:

Code& Code::bset(const DataRegister& dx, const Param& target)
{
    uint16_t opcode = 0x01C0 + (dx.getXn() << 9) + target.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(target.getAdditionnalData());
    return *this;
}